

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-async-null-cb.c
# Opt level: O0

int run_test_async_null_cb(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  
  memset(&async_handle,0xff,0x80);
  uVar2 = uv_default_loop();
  iVar1 = uv_async_init(uVar2,&async_handle,0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-async-null-cb.c"
            ,0x37,"0 == uv_async_init(uv_default_loop(), &async_handle, NULL)");
    abort();
  }
  uVar2 = uv_default_loop();
  iVar1 = uv_check_init(uVar2,&check_handle);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-async-null-cb.c"
            ,0x38,"0 == uv_check_init(uv_default_loop(), &check_handle)");
    abort();
  }
  iVar1 = uv_check_start(&check_handle,check_cb);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-async-null-cb.c"
            ,0x39,"0 == uv_check_start(&check_handle, check_cb)");
    abort();
  }
  iVar1 = uv_thread_create(&thread,thread_cb,0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-async-null-cb.c"
            ,0x3a,"0 == uv_thread_create(&thread, thread_cb, NULL)");
    abort();
  }
  uVar2 = uv_default_loop();
  iVar1 = uv_run(uVar2,0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-async-null-cb.c"
            ,0x3b,"0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT)");
    abort();
  }
  iVar1 = uv_thread_join(&thread);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-async-null-cb.c"
            ,0x3c,"0 == uv_thread_join(&thread)");
    abort();
  }
  if (check_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-async-null-cb.c"
            ,0x3d,"1 == check_cb_called");
    abort();
  }
  loop = (uv_loop_t *)uv_default_loop();
  close_loop(loop);
  uVar2 = uv_default_loop();
  iVar1 = uv_loop_close(uVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-async-null-cb.c"
            ,0x3e,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(async_null_cb) {
  /*
   * Fill async_handle with garbage values.
   * uv_async_init() should properly initialize struct fields regardless of
   * initial values.
   * This is added to verify paddings between fields do not affect behavior.
   */
  memset(&async_handle, 0xff, sizeof(async_handle));

  ASSERT(0 == uv_async_init(uv_default_loop(), &async_handle, NULL));
  ASSERT(0 == uv_check_init(uv_default_loop(), &check_handle));
  ASSERT(0 == uv_check_start(&check_handle, check_cb));
  ASSERT(0 == uv_thread_create(&thread, thread_cb, NULL));
  ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT));
  ASSERT(0 == uv_thread_join(&thread));
  ASSERT(1 == check_cb_called);
  MAKE_VALGRIND_HAPPY();
  return 0;
}